

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
pseudo_sample<unsigned_short,std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
          (uchar **strings,size_t n)

{
  uchar *ptr;
  bool bVar1;
  uint16_t c_00;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this_00
  ;
  reference ppvVar2;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
  *pTStack_58;
  unsigned_short c;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *node;
  size_t depth;
  uchar *str;
  size_t i;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *root;
  size_t max_nodes;
  size_t n_local;
  uchar **strings_local;
  
  root = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          *)0x7d0;
  this = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          *)operator_new(0x18);
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::
  TrieNode(this);
  str = (uchar *)0x0;
  do {
    if (n <= str) {
      return this;
    }
    ptr = strings[(long)str];
    node = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
            *)0x0;
    pTStack_58 = this;
    while( true ) {
      c_00 = get_char<unsigned_short>(ptr,(size_t)node);
      bVar1 = is_end<unsigned_short>(c_00);
      if (bVar1) break;
      node = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              *)((long)&(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                        .super__Vector_impl_data._M_start + 2);
      TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::
      extend(pTStack_58,c_00 + 1);
      bVar1 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              ::is_trie(pTStack_58,(uint)c_00);
      if (!bVar1) {
        this_00 = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                   *)operator_new(0x18);
        TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::
        TrieNode(this_00);
        ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            (&pTStack_58->_buckets,(ulong)c_00);
        *ppvVar2 = this_00;
        ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            (&pTStack_58->_buckets,(ulong)c_00);
        make_trie(ppvVar2);
        root = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                *)((long)&root[-1]._buckets.super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        if (root == (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                     *)0x0) {
          return this;
        }
      }
      pTStack_58 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                   ::get_node(pTStack_58,(uint)c_00);
      if (pTStack_58 ==
          (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
           *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xd9,
                      "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                     );
      }
    }
    str = str + 0x2000;
  } while( true );
}

Assistant:

static TrieNode<CharT, BucketT>*
pseudo_sample(unsigned char** strings, size_t n)
{
	debug()<<__func__<<"(): sampling "<<n/8192<<" strings ...\n";
	size_t max_nodes = (sizeof(CharT) == 1) ? 5000 : 2000;
	TrieNode<CharT, BucketT>* root = new TrieNode<CharT, BucketT>;
	for (size_t i=0; i < n; i += 8192) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		TrieNode<CharT, BucketT>* node = root;
		while (true) {
			CharT c = get_char<CharT>(str, depth);
			if (is_end(c)) break;
			depth += sizeof(CharT);
			node->extend(c+1);
			if (not node->is_trie(c)) {
				node->_buckets[c] = new TrieNode<CharT, BucketT>;
				make_trie(node->_buckets[c]);
				if (--max_nodes==0) goto finish;
			}
			node = node->get_node(c);
			assert(node);
		}
	}
finish:
	return root;
}